

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O1

curl_slist * Curl_slist_append_nodup(curl_slist *list,char *data)

{
  curl_slist *pcVar1;
  curl_slist *pcVar2;
  curl_slist *pcVar3;
  
  pcVar2 = (curl_slist *)(*Curl_cmalloc)(0x10);
  if (pcVar2 == (curl_slist *)0x0) {
    pcVar2 = (curl_slist *)0x0;
  }
  else {
    pcVar2->next = (curl_slist *)0x0;
    pcVar2->data = data;
    pcVar1 = list;
    if (list != (curl_slist *)0x0) {
      do {
        pcVar3 = pcVar1;
        pcVar1 = pcVar3->next;
      } while (pcVar1 != (curl_slist *)0x0);
      pcVar3->next = pcVar2;
      pcVar2 = list;
    }
  }
  return pcVar2;
}

Assistant:

struct curl_slist *Curl_slist_append_nodup(struct curl_slist *list, char *data)
{
  struct curl_slist     *last;
  struct curl_slist     *new_item;

  DEBUGASSERT(data);

  new_item = malloc(sizeof(struct curl_slist));
  if(!new_item)
    return NULL;

  new_item->next = NULL;
  new_item->data = data;

  /* if this is the first item, then new_item *is* the list */
  if(!list)
    return new_item;

  last = slist_get_last(list);
  last->next = new_item;
  return list;
}